

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTxyz.cpp
# Opt level: O1

void __thiscall OpenMD::NPTxyz::scaleSimBox(NPTxyz *this)

{
  double *pdVar1;
  uint i;
  double *pdVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  uint k;
  double (*__return_storage_ptr__) [3];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  bool bVar13;
  undefined8 uVar14;
  Mat3x3d scaleMat;
  SquareMatrix3<double> result;
  Mat3x3d hmat;
  double local_f8 [20];
  Mat3x3d local_58;
  long lVar12;
  
  pdVar2 = local_f8 + 1;
  local_f8[6] = 0.0;
  local_f8[7] = 0.0;
  local_f8[4] = 0.0;
  local_f8[5] = 0.0;
  local_f8[2] = 0.0;
  local_f8[3] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[8] = 0.0;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    auVar11 = _DAT_002961e0;
    do {
      bVar13 = SUB164(auVar11 ^ _DAT_002961f0,4) == -0x80000000 &&
               SUB164(auVar11 ^ _DAT_002961f0,0) < -0x7ffffffd;
      if (bVar13) {
        uVar14 = 0x3ff0000000000000;
        if (lVar3 != lVar5) {
          uVar14 = 0;
        }
        *(undefined8 *)((long)pdVar2 + lVar5 + -8) = uVar14;
      }
      if (bVar13) {
        uVar14 = 0x3ff0000000000000;
        if (lVar3 + -8 != lVar5) {
          uVar14 = 0;
        }
        *(undefined8 *)((long)pdVar2 + lVar5) = uVar14;
      }
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar12 + 2;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x20);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 8;
    pdVar2 = pdVar2 + 3;
  } while (lVar4 != 3);
  lVar3 = 0;
  dVar9 = 1.0;
  dVar7 = 1.0;
  do {
    dVar8 = exp((this->super_NPTf).super_NPT.super_VelocityVerletIntegrator.super_Integrator.dt *
                *(double *)
                 ((long)(this->super_NPTf).eta.super_SquareMatrix<double,_3>.
                        super_RectMatrix<double,_3U,_3U>.data_[0] + lVar3));
    *(double *)((long)local_f8 + lVar3) = dVar8;
    dVar10 = dVar8;
    if (dVar8 <= dVar9) {
      dVar10 = dVar9;
    }
    if (dVar7 <= dVar8) {
      dVar8 = dVar7;
    }
    lVar3 = lVar3 + 0x20;
    dVar9 = dVar10;
    dVar7 = dVar8;
  } while (lVar3 != 0x60);
  if ((dVar10 <= 1.1) && (0.9 <= dVar8)) {
    __return_storage_ptr__ = (double (*) [3])&local_58;
    Snapshot::getHmat((Mat3x3d *)__return_storage_ptr__,
                      (this->super_NPTf).super_NPT.super_VelocityVerletIntegrator.super_Integrator.
                      snap);
    local_f8[0x10] = 0.0;
    local_f8[0x11] = 0.0;
    local_f8[0xe] = 0.0;
    local_f8[0xf] = 0.0;
    local_f8[0xc] = 0.0;
    local_f8[0xd] = 0.0;
    local_f8[10] = 0.0;
    local_f8[0xb] = 0.0;
    local_f8[0x12] = 0.0;
    lVar3 = 0;
    do {
      lVar4 = 0;
      pdVar2 = local_f8;
      do {
        pdVar1 = local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                 [lVar3 + -4] + lVar4 + 2;
        dVar9 = *pdVar1;
        lVar5 = 0;
        pdVar6 = pdVar2;
        do {
          dVar9 = dVar9 + (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                          super_RectMatrix<double,_3U,_3U>).data_[0][lVar5] * *pdVar6;
          lVar5 = lVar5 + 1;
          pdVar6 = pdVar6 + 3;
        } while (lVar5 != 3);
        *pdVar1 = dVar9;
        lVar4 = lVar4 + 1;
        pdVar2 = pdVar2 + 1;
      } while (lVar4 != 3);
      lVar3 = lVar3 + 1;
      __return_storage_ptr__ = __return_storage_ptr__ + 1;
    } while (lVar3 != 3);
    lVar3 = 0;
    do {
      *(undefined8 *)
       ((long)local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar3 + 0x10) = *(undefined8 *)((long)local_f8 + lVar3 + 0x60U);
      uVar14 = *(undefined8 *)((long)local_f8 + lVar3 + 0x58U);
      *(undefined8 *)
       ((long)local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar3) = *(undefined8 *)((long)local_f8 + lVar3 + 0x50U);
      *(undefined8 *)
       ((long)local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar3 + 8) = uVar14;
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x48);
    Snapshot::setHmat((this->super_NPTf).super_NPT.super_VelocityVerletIntegrator.super_Integrator.
                      snap,&local_58);
    return;
  }
  snprintf(painCave.errMsg,2000,
           "NPTxyz error: Attempting a Box scaling of more than 10 percent.\n Check your tauBarostat, as it is probably too small!\n\n scaleMat = [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n"
           ,local_f8[0],local_f8[1],local_f8[2],local_f8[3],local_f8[4],local_f8[5],local_f8[6],
           local_f8[7]);
  painCave.isFatal = 1;
  simError();
  return;
}

Assistant:

void NPTxyz::scaleSimBox() {
    int i, j;
    Mat3x3d scaleMat;
    RealType scaleFactor;
    RealType bigScale, smallScale;
    Mat3x3d hm;
    Mat3x3d hmnew;

    // Scale the box after all the positions have been moved:

    // Use a taylor expansion for eta products:  Hmat = Hmat . exp(dt * etaMat)
    //  Hmat = Hmat . ( Ident + dt * etaMat  + dt^2 * etaMat*etaMat / 2)

    bigScale   = 1.0;
    smallScale = 1.0;

    for (i = 0; i < 3; i++) {
      for (j = 0; j < 3; j++) {
        scaleMat(i, j) = 0.0;
        if (i == j) { scaleMat(i, j) = 1.0; }
      }
    }

    for (i = 0; i < 3; i++) {
      // calculate the scaleFactors

      scaleFactor = exp(dt * eta(i, i));

      scaleMat(i, i) = scaleFactor;

      if (scaleMat(i, i) > bigScale) { bigScale = scaleMat(i, i); }

      if (scaleMat(i, i) < smallScale) { smallScale = scaleMat(i, i); }
    }

    if ((bigScale > 1.1) || (smallScale < 0.9)) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "NPTxyz error: Attempting a Box scaling of more than 10 percent.\n"
          " Check your tauBarostat, as it is probably too small!\n\n"
          " scaleMat = [%lf\t%lf\t%lf]\n"
          "            [%lf\t%lf\t%lf]\n"
          "            [%lf\t%lf\t%lf]\n",
          scaleMat(0, 0), scaleMat(0, 1), scaleMat(0, 2), scaleMat(1, 0),
          scaleMat(1, 1), scaleMat(1, 2), scaleMat(2, 0), scaleMat(2, 1),
          scaleMat(2, 2));
      painCave.isFatal = 1;
      simError();
    } else {
      Mat3x3d hmat = snap->getHmat();
      hmat         = hmat * scaleMat;
      snap->setHmat(hmat);
    }
  }